

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_ubjson_size_type
          (binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,pair<unsigned_long,_unsigned_long> *result)

{
  byte bVar1;
  byte *pbVar2;
  json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  bool bVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R9;
  ulong uStack_e0;
  string local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  string last_token;
  undefined **local_48 [2];
  runtime_error local_38 [24];
  
  result->first = 0xffffffffffffffff;
  result->second = 0;
  pbVar5 = (this->ia).current._M_current;
  pbVar2 = (this->ia).end._M_current;
  sVar4 = this->chars_read + 1;
  do {
    this->chars_read = sVar4;
    uVar6 = 0xffffffffffffffff;
    if (pbVar5 != pbVar2) {
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      (this->ia).current._M_current = pbVar5;
      uVar6 = (ulong)bVar1;
    }
    this->current = uVar6;
    sVar4 = sVar4 + 1;
  } while (uVar6 == 0x4e);
  if (uVar6 == 0x24) {
    this->chars_read = sVar4;
    pbVar5 = (this->ia).current._M_current;
    if (pbVar5 == pbVar2) {
      uStack_e0 = 0xffffffffffffffff;
    }
    else {
      uStack_e0 = (ulong)*pbVar5;
      (this->ia).current._M_current = pbVar5 + 1;
    }
    this->current = uStack_e0;
    result->second = uStack_e0;
    bVar3 = unexpect_eof(this,ubjson,"type");
    if (bVar3) {
      pbVar5 = (this->ia).current._M_current;
      pbVar2 = (this->ia).end._M_current;
      sVar4 = this->chars_read;
      do {
        sVar4 = sVar4 + 1;
        this->chars_read = sVar4;
        uVar6 = 0xffffffffffffffff;
        if (pbVar5 != pbVar2) {
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          (this->ia).current._M_current = pbVar5;
          uVar6 = (ulong)bVar1;
        }
        this->current = uVar6;
      } while (uVar6 == 0x4e);
      if (uVar6 == 0x23) goto LAB_0010f685;
      bVar3 = unexpect_eof(this,ubjson,"value");
      if (bVar3) {
        get_token_string(&last_token,this);
        sVar4 = this->chars_read;
        this_00 = this->sax;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_b8 + 0x10),"expected \'#\' after type information; last byte: 0x",
                       &last_token);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"size","");
        exception_message(&local_88,this,ubjson,(string *)(local_b8 + 0x10),&local_d8);
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_b8,(nullptr_t)0x0);
        parse_error::
        create<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((parse_error *)local_48,(parse_error *)0x70,(int)sVar4,(size_t)&local_88,
                   (string *)local_b8,in_R9);
        bVar3 = json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::parse_error<nlohmann::detail::parse_error>
                          (this_00,sVar4,&last_token,(parse_error *)local_48);
        local_48[0] = &PTR__exception_002613a8;
        std::runtime_error::~runtime_error
                  ((runtime_error *)((long)&((parse_error *)local_48)->super_exception + 0x10));
        std::exception::~exception((exception *)local_48);
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._16_8_ != &local_98) {
          operator_delete((void *)local_b8._16_8_,local_98._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)last_token._M_dataplus._M_p == &last_token.field_2) {
          return bVar3;
        }
        operator_delete(last_token._M_dataplus._M_p,last_token.field_2._M_allocated_capacity + 1);
        return bVar3;
      }
    }
    bVar3 = false;
  }
  else {
    if (uVar6 == 0x23) {
LAB_0010f685:
      bVar3 = get_ubjson_size_value(this,&result->first);
      return bVar3;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool get_ubjson_size_type(std::pair<std::size_t, char_int_type>& result)
    {
        result.first = string_t::npos; // size
        result.second = 0; // type

        get_ignore_noop();

        if (current == '$')
        {
            result.second = get();  // must not ignore 'N', because 'N' maybe the type
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "type")))
            {
                return false;
            }

            get_ignore_noop();
            if (JSON_HEDLEY_UNLIKELY(current != '#'))
            {
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "value")))
                {
                    return false;
                }
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "expected '#' after type information; last byte: 0x" + last_token, "size"), BasicJsonType()));
            }

            return get_ubjson_size_value(result.first);
        }

        if (current == '#')
        {
            return get_ubjson_size_value(result.first);
        }

        return true;
    }